

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  _Alloc_hider this_00;
  long lVar1;
  long lVar2;
  string local_48;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "if (jspb.Message.GENERATE_FROM_OBJECT) {\n/**\n * Loads data from an object into a new instance of this proto.\n * @param {!Object} obj The object representation of this proto to\n *     load the data from.\n * @return {!$classname$}\n */\n$classname$.fromObject = function(obj) {\n  var f, msg = new $classname$();\n"
                     ,"classname",&local_48);
  this_00._M_p = local_48._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    this_00._M_p = local_48._M_dataplus._M_p;
  }
  if (0 < *(int *)(desc + 0x2c)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      GenerateClassFieldFromObject
                ((Generator *)this_00._M_p,options,printer,
                 (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0xa8;
    } while (lVar2 < *(int *)(desc + 0x2c));
  }
  io::Printer::Print(printer,"  return msg;\n};\n}\n");
  return;
}

Assistant:

void Generator::GenerateClassFromObject(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const Descriptor* desc) const {
  printer->Print(
      "if (jspb.Message.GENERATE_FROM_OBJECT) {\n"
      "/**\n"
      " * Loads data from an object into a new instance of this proto.\n"
      " * @param {!Object} obj The object representation of this proto to\n"
      " *     load the data from.\n"
      " * @return {!$classname$}\n"
      " */\n"
      "$classname$.fromObject = function(obj) {\n"
      "  var f, msg = new $classname$();\n",
      "classname", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    GenerateClassFieldFromObject(options, printer, field);
  }

  printer->Print(
      "  return msg;\n"
      "};\n"
      "}\n");
}